

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O1

void __thiscall
miniros::ServiceClientLink::onRequest
          (ServiceClientLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  int iVar1;
  ServicePublication *this_00;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined3 in_register_00000081;
  bool bVar3;
  shared_ptr<unsigned_char[]> local_38;
  ServiceClientLinkPtr local_28;
  
  if (CONCAT31(in_register_00000081,success) != 0) {
    this_01 = (this->parent_).
              super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = this_01->_M_use_count;
      do {
        if (iVar2 == 0) {
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = this_01->_M_use_count;
        bVar3 = iVar2 == iVar1;
        if (bVar3) {
          this_01->_M_use_count = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar3);
    }
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = this_01->_M_use_count == 0;
    }
    this_00 = (this->parent_).
              super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!(bool)(this_00 == (ServicePublication *)0x0 | bVar3)) {
      local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (buffer->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (buffer->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      std::__shared_ptr<miniros::ServiceClientLink,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::ServiceClientLink,void>
                ((__shared_ptr<miniros::ServiceClientLink,(__gnu_cxx::_Lock_policy)2> *)&local_28,
                 (__weak_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<miniros::ServiceClientLink>);
      ServicePublication::processRequest(this_00,&local_38,(ulong)size,&local_28);
      if (local_28.super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.
                   super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  return;
}

Assistant:

void ServiceClientLink::onRequest(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)conn;
  if (!success)
    return;

  MINIROS_ASSERT(conn == connection_);

  if (ServicePublicationPtr parent = parent_.lock())
  {
    parent->processRequest(buffer, size, shared_from_this());
  }
  else
  {
    MINIROS_BREAK();
  }
}